

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_mbox.hpp
# Opt level: O3

void __thiscall
so_5::impl::local_mbox_details::subscriber_adaptive_container_t::switch_storage_to_map
          (subscriber_adaptive_container_t *this)

{
  pointer psVar1;
  pointer psVar2;
  map_type new_storage;
  agent_t *local_60;
  _Rb_tree<so_5::agent_t_*,_std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>,_std::_Select1st<std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>_>,_so_5::impl::local_mbox_details::subscriber_adaptive_container_t::agent_ptr_compare_type,_std::allocator<std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>_>_>
  local_58;
  
  local_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58._M_impl.super__Rb_tree_header._M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  psVar2 = (this->m_vector).
           super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_vector).
           super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58._M_impl.super__Rb_tree_header._M_header._M_left;
  if (psVar2 != psVar1) {
    do {
      local_60 = psVar2->m_agent;
      std::
      _Rb_tree<so_5::agent_t*,std::pair<so_5::agent_t*const,so_5::impl::local_mbox_details::subscriber_info_t>,std::_Select1st<std::pair<so_5::agent_t*const,so_5::impl::local_mbox_details::subscriber_info_t>>,so_5::impl::local_mbox_details::subscriber_adaptive_container_t::agent_ptr_compare_type,std::allocator<std::pair<so_5::agent_t*const,so_5::impl::local_mbox_details::subscriber_info_t>>>
      ::_M_emplace_unique<so_5::agent_t*,so_5::impl::local_mbox_details::subscriber_info_t_const&>
                ((_Rb_tree<so_5::agent_t*,std::pair<so_5::agent_t*const,so_5::impl::local_mbox_details::subscriber_info_t>,std::_Select1st<std::pair<so_5::agent_t*const,so_5::impl::local_mbox_details::subscriber_info_t>>,so_5::impl::local_mbox_details::subscriber_adaptive_container_t::agent_ptr_compare_type,std::allocator<std::pair<so_5::agent_t*const,so_5::impl::local_mbox_details::subscriber_info_t>>>
                  *)&local_58,&local_60,psVar2);
      psVar2 = psVar2 + 1;
    } while (psVar2 != psVar1);
  }
  std::
  _Rb_tree<so_5::agent_t_*,_std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>,_std::_Select1st<std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>_>,_so_5::impl::local_mbox_details::subscriber_adaptive_container_t::agent_ptr_compare_type,_std::allocator<std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>_>_>
  ::swap(&(this->m_map)._M_t,&local_58);
  psVar2 = (this->m_vector).
           super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->m_vector).
  super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vector).
  super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vector).
  super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_storage = map;
  std::
  _Rb_tree<so_5::agent_t_*,_std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>,_std::_Select1st<std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>_>,_so_5::impl::local_mbox_details::subscriber_adaptive_container_t::agent_ptr_compare_type,_std::allocator<std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>_>_>
  ::~_Rb_tree(&local_58);
  if (psVar2 != (pointer)0x0) {
    operator_delete(psVar2);
  }
  return;
}

Assistant:

void
	switch_storage_to_map()
		{
			vector_type empty_vector;

			map_type new_storage;
			std::for_each( m_vector.begin(), m_vector.end(),
				[&new_storage]( const subscriber_info_t & info ) {
					new_storage.emplace( info.subscriber_pointer(), info );
				} );

			m_map.swap( new_storage );
			m_vector.swap( empty_vector );
			m_storage = storage_type::map;
		}